

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

void Js::JavascriptObject::CopyDataPropertiesForGenericObjects<true>
               (RecyclableObject *from,RecyclableObject *to,BVSparse<Memory::Recycler> *excluded,
               ScriptContext *scriptContext)

{
  PropertyRecord *obj;
  EnumeratorFlags EVar1;
  BOOLEAN BVar2;
  int iVar3;
  BOOL BVar4;
  JavascriptLibrary *this;
  Type *type;
  PCWSTR pWVar5;
  bool bVar6;
  PropertyString *local_148;
  undefined1 local_130 [8];
  PropertyValueInfo setPropertyInfo;
  PropertyValueInfo getPropertyInfo;
  PropertyString *propertyString;
  PropertyRecord *pPStack_a0;
  bool found;
  PropertyRecord *propertyRecord;
  JavascriptString *propertyName;
  Var propValue;
  undefined1 local_80 [4];
  PropertyId nextKey;
  JavascriptStaticEnumerator enumerator;
  EnumeratorCache *cache;
  ScriptContext *scriptContext_local;
  BVSparse<Memory::Recycler> *excluded_local;
  RecyclableObject *to_local;
  RecyclableObject *from_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  type = RecyclableObject::GetType(from);
  enumerator.arrayEnumerator.ptr =
       (JavascriptEnumerator *)JavascriptLibrary::GetObjectAssignCache(this,type);
  JavascriptStaticEnumerator::JavascriptStaticEnumerator((JavascriptStaticEnumerator *)local_80);
  EVar1 = operator|(SnapShotSemantics,EnumSymbols);
  EVar1 = operator|(EVar1,UseCache);
  iVar3 = (*(from->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])
                    (from,local_80,(ulong)EVar1,scriptContext,enumerator.arrayEnumerator.ptr);
  if (iVar3 != 0) {
    propValue._4_4_ = 0xffffffff;
    propertyName = (JavascriptString *)0x0;
    propertyRecord = (PropertyRecord *)0x0;
    while (propertyRecord =
                (PropertyRecord *)
                JavascriptStaticEnumerator::MoveAndGetNext
                          ((JavascriptStaticEnumerator *)local_80,
                           (PropertyId *)((long)&propValue + 4),(PropertyAttributes *)0x0),
          (JavascriptString *)propertyRecord != (JavascriptString *)0x0) {
      if (propValue._4_4_ == 0xffffffff) {
        pPStack_a0 = (PropertyRecord *)0x0;
        ScriptContext::GetOrAddPropertyRecord
                  (scriptContext,(JavascriptString *)propertyRecord,&stack0xffffffffffffff60);
        propValue._4_4_ = PropertyRecord::GetPropertyId(pPStack_a0);
      }
      bVar6 = false;
      if (excluded != (BVSparse<Memory::Recycler> *)0x0) {
        BVar2 = BVSparse<Memory::Recycler>::Test(excluded,propValue._4_4_);
        bVar6 = BVar2 != '\0';
      }
      obj = propertyRecord;
      if (!bVar6) {
        bVar6 = VarIs<Js::PropertyString,Js::JavascriptString>((JavascriptString *)propertyRecord);
        if (bVar6) {
          local_148 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>((JavascriptString *)obj);
        }
        else {
          local_148 = (PropertyString *)0x0;
        }
        PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&setPropertyInfo.inlineCacheIndex)
        ;
        if (((local_148 == (PropertyString *)0x0) ||
            (bVar6 = PropertyString::TryGetPropertyFromCache<true,false>
                               (local_148,from,from,&propertyName,scriptContext,
                                (PropertyValueInfo *)&setPropertyInfo.inlineCacheIndex), !bVar6)) &&
           (BVar4 = Js::JavascriptOperators::GetOwnProperty
                              (from,propValue._4_4_,&propertyName,scriptContext,
                               (PropertyValueInfo *)&setPropertyInfo.inlineCacheIndex), BVar4 == 0))
        {
          pWVar5 = GetCopyDataPropertiesEntryName<true>();
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec36,pWVar5);
        }
        PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_130);
        if (((local_148 == (PropertyString *)0x0) ||
            (bVar6 = PropertyString::TrySetPropertyFromCache
                               (local_148,to,propertyName,scriptContext,
                                PropertyOperation_ThrowIfNonWritable,(PropertyValueInfo *)local_130)
            , !bVar6)) &&
           (BVar4 = Js::JavascriptOperators::SetProperty
                              (to,to,propValue._4_4_,propertyName,(PropertyValueInfo *)local_130,
                               scriptContext,PropertyOperation_ThrowIfNonWritable), BVar4 == 0)) {
          pWVar5 = GetCopyDataPropertiesEntryName<true>();
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec36,pWVar5);
        }
      }
    }
  }
  return;
}

Assistant:

void JavascriptObject::CopyDataPropertiesForGenericObjects(RecyclableObject* from, RecyclableObject* to, const BVSparse<Recycler>* excluded, ScriptContext* scriptContext)
{
    // Steps 4 and 5 of CopyDataPropertiesHelper

    EnumeratorCache* cache = scriptContext->GetLibrary()->GetObjectAssignCache(from->GetType());
    JavascriptStaticEnumerator enumerator;
    if (!from->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::EnumSymbols | EnumeratorFlags::UseCache, scriptContext, cache))
    {
        // Nothing to enumerate, continue with the nextSource.
        return;
    }

    PropertyId nextKey = Constants::NoProperty;
    Var propValue = nullptr;
    JavascriptString * propertyName = nullptr;

    // Enumerate through each property of properties and fetch the property descriptor
    while ((propertyName = enumerator.MoveAndGetNext(nextKey)) != NULL)
    {
        // Make sure nextKey is defined for the current propertyName
        if (nextKey == Constants::NoProperty)
        {
            PropertyRecord const * propertyRecord = nullptr;

            scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
            nextKey = propertyRecord->GetPropertyId();
        }

        bool found = false;
        if (excluded)
        {
            found = excluded->Test(nextKey);
        }
        if (!found)
        {
            PropertyString * propertyString = JavascriptOperators::TryFromVar<PropertyString>(propertyName);

            // If propertyName is a PropertyString* we can try getting the property from the inline cache to avoid having a full property lookup
            //
            // Whenever possible, our enumerator populates the cache, so we should generally get a cache hit here
            PropertyValueInfo getPropertyInfo;
            if (propertyString == nullptr || !propertyString->TryGetPropertyFromCache<true /* OwnPropertyOnly */, false /* OutputExistence */>(from, from, &propValue, scriptContext, &getPropertyInfo))
            {
                if (!JavascriptOperators::GetOwnProperty(from, nextKey, &propValue, scriptContext, &getPropertyInfo))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                }
            }

            if (assign)
            {
                // Similarly, try to set the property using our cache to avoid having to do the full work of SetProperty
                PropertyValueInfo setPropertyInfo;
                if (propertyString == nullptr || !propertyString->TrySetPropertyFromCache(to, propValue, scriptContext, PropertyOperation_ThrowIfNonWritable, &setPropertyInfo))
                {
                    if (!JavascriptOperators::SetProperty(to, to, nextKey, propValue, &setPropertyInfo, scriptContext, PropertyOperation_ThrowIfNonWritable))
                    {
                        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                    }
                }
            }
            else
            {
                //TODO[t-huyan]: potentially use caching to improve efficiency? (see AssignForGenericObjects implementation)
                if (!CreateDataProperty(to, nextKey, propValue, scriptContext))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                }
            }
        }
    }
}